

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

bool __thiscall
TgBot::Api::promoteChatMember
          (Api *this,int64_t chatId,int32_t userId,bool canChangeInfo,bool canPostMessages,
          bool canEditMessages,bool canDeleteMessages,bool canInviteUsers,bool canPinMessages,
          bool canPromoteMembers)

{
  type_conflict tVar1;
  bool local_da [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  allocator local_a1;
  string local_a0;
  ptree local_80;
  undefined1 local_48 [8];
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  bool canPromoteMembers_local;
  bool canPinMessages_local;
  int32_t iStack_24;
  bool canInviteUsers_local;
  bool canDeleteMessages_local;
  bool canEditMessages_local;
  bool canPostMessages_local;
  bool canChangeInfo_local;
  int32_t userId_local;
  int64_t chatId_local;
  Api *this_local;
  
  local_28 = canDeleteMessages;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = canInviteUsers;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = canPinMessages;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = canPromoteMembers;
  local_27 = canEditMessages;
  local_26 = canPostMessages;
  local_25 = canChangeInfo;
  iStack_24 = userId;
  _canDeleteMessages_local = chatId;
  chatId_local = (int64_t)this;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48,9);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
             (char (*) [8])0x4758d6,(long *)&canDeleteMessages_local);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
             (char (*) [8])"user_id",&stack0xffffffffffffffdc);
  if ((local_25 & 1U) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[16],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [16])"can_change_info",&local_25);
  }
  if ((local_26 & 1U) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[18],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [18])"can_post_messages",&local_26);
  }
  if ((local_27 & 1U) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[18],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [18])"can_edit_messages",&local_27);
  }
  if ((local_28 & 1U) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [20])"can_delete_messages",&local_28);
  }
  if ((args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[17],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [17])"can_invite_users",
               (bool *)((long)&args.
                               super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  if ((args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[17],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [17])"can_pin_messages",
               (bool *)((long)&args.
                               super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  }
  if ((args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [20])"can_promote_members",
               (bool *)((long)&args.
                               super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"promoteChatMember",&local_a1);
  sendRequest(&local_80,this,&local_a0,
              (vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_d8,"",0x2e);
  local_da[0] = false;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(&local_80,&local_d8,local_da);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_d8);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  return tVar1;
}

Assistant:

bool Api::promoteChatMember(int64_t chatId, int32_t userId, bool canChangeInfo, bool canPostMessages,
                            bool canEditMessages, bool canDeleteMessages, bool canInviteUsers, bool canPinMessages, bool canPromoteMembers) const {
    vector<HttpReqArg> args;
    args.reserve(9);
    args.emplace_back("chat_id", chatId);
    args.emplace_back("user_id", userId);
    if (canChangeInfo) {
        args.emplace_back("can_change_info", canChangeInfo);
    }
    if (canPostMessages) {
        args.emplace_back("can_post_messages", canPostMessages);
    }
    if (canEditMessages) {
        args.emplace_back("can_edit_messages", canEditMessages);
    }
    if (canDeleteMessages) {
        args.emplace_back("can_delete_messages", canDeleteMessages);
    }
    if (canInviteUsers) {
        args.emplace_back("can_invite_users", canInviteUsers);
    }
    if (canPinMessages) {
        args.emplace_back("can_pin_messages", canPinMessages);
    }
    if (canPromoteMembers) {
        args.emplace_back("can_promote_members", canPromoteMembers);
    }
    return sendRequest("promoteChatMember", args).get<bool>("", false);
}